

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_array.c
# Opt level: O2

void * find_in_curious_dynamic_array
                 (curious_dynamic_array_t *self,void *value,compare_f compare_to_el)

{
  int iVar1;
  void *pvVar2;
  int i;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (self->last_el < lVar3) {
      return (void *)0x0;
    }
    pvVar2 = (void *)(self->el_size * lVar3 + (long)self->array);
    iVar1 = (*compare_to_el)(value,pvVar2);
    lVar3 = lVar3 + 1;
  } while (iVar1 != 0);
  return pvVar2;
}

Assistant:

void* find_in_curious_dynamic_array(curious_dynamic_array_t* self, void* value, compare_f compare_to_el)
{
    for (int i = 0; i <= self->last_el; ++i) {
        void* el = get_from_curious_dynamic_array(self, i);

        if (0 == compare_to_el(value, el)) {
            return el;
        }
    }

    return NULL;
}